

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

bool __thiscall jbcoin::Serializer::getVLLength(Serializer *this,int *length,int offset)

{
  ulong uVar1;
  byte bVar2;
  pointer puVar3;
  int iVar4;
  ulong uVar5;
  uint b1;
  ulong uVar6;
  
  uVar6 = (ulong)offset;
  puVar3 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar6) {
    return false;
  }
  uVar1 = uVar6 + 1;
  bVar2 = puVar3[uVar6];
  iVar4 = decodeLengthLength((uint)bVar2);
  if (iVar4 == 2) {
    puVar3 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3) <= uVar1) {
      return false;
    }
    iVar4 = decodeVLLength((uint)bVar2,(uint)puVar3[uVar1]);
  }
  else {
    b1 = (uint)bVar2;
    if (iVar4 == 1) {
      decodeVLLength(b1);
      *length = b1;
      return true;
    }
    puVar3 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar5 = (long)(this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
    if (uVar5 <= uVar1) {
      return false;
    }
    if (uVar5 <= uVar6 + 2) {
      return false;
    }
    iVar4 = decodeVLLength(b1,(uint)puVar3[uVar1],(uint)puVar3[uVar6 + 2]);
  }
  *length = iVar4;
  return true;
}

Assistant:

bool Serializer::getVLLength (int& length, int offset) const
{
    int b1;

    if (!get8 (b1, offset++)) return false;

    int lenLen = decodeLengthLength (b1);

    try
    {
        if (lenLen == 1)
            length = decodeVLLength (b1);
        else if (lenLen == 2)
        {
            int b2;

            if (!get8 (b2, offset++)) return false;

            length = decodeVLLength (b1, b2);
        }
        else if (lenLen == 3)
        {
            int b2, b3;

            if (!get8 (b2, offset++)) return false;

            if (!get8 (b3, offset++)) return false;

            length = decodeVLLength (b1, b2, b3);
        }
        else return false;
    }
    catch (std::exception const&)
    {
        return false;
    }

    return true;
}